

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O1

string * __thiscall
CivetServer::getPostData_abi_cxx11_
          (string *__return_storage_ptr__,CivetServer *this,mg_connection *conn)

{
  int iVar1;
  char buf [2048];
  undefined1 auStack_828 [2056];
  
  mg_lock_connection((mg_connection *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = mg_read((mg_connection *)this,auStack_828,0x800);
  while (0 < iVar1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)auStack_828);
    iVar1 = mg_read((mg_connection *)this,auStack_828,0x800);
  }
  mg_unlock_connection((mg_connection *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string
CivetServer::getPostData(struct mg_connection *conn)
{
	mg_lock_connection(conn);
	std::string postdata;
	char buf[2048];
	int r = mg_read(conn, buf, sizeof(buf));
	while (r > 0) {
		postdata.append(buf, r);
		r = mg_read(conn, buf, sizeof(buf));
	}
	mg_unlock_connection(conn);
	return postdata;
}